

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
::emplace_new_key<slang::ConstantValue&,slang::SourceRange_const&>
          (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,ConstantValue *key,
          SourceRange *args)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
  pVar7;
  bool local_ad [13];
  templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_> local_a0;
  iterator result;
  value_type to_insert;
  templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_> local_58 [3];
  SourceRange *local_40;
  SourceRange *args_local;
  ConstantValue *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
  *this_local;
  bool local_10;
  
  local_40 = args;
  args_local = (SourceRange *)key;
  key_local = (ConstantValue *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 0x10) != 0) &&
     ((sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
       )distance_from_desired != this[0x19])) {
    lVar3 = *(long *)(this + 0x20) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 0x10) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x1c)) {
      bVar1 = sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>::is_empty
                        (current_entry);
      if (bVar1) {
        sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>::
        emplace<slang::ConstantValue&,slang::SourceRange_const&>
                  ((sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>> *)
                   key_local,(int8_t)current_entry_local._7_1_,(ConstantValue *)args_local,local_40)
        ;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
        ::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>::
        templated_iterator(local_58,(EntryPointer)key_local);
        to_insert.second.endLoc._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
                            *)&this_local,local_58,(bool *)&to_insert.second.endLoc.field_0x7);
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        std::pair<slang::ConstantValue,_slang::SourceRange>::pair<slang::ConstantValue_&,_true>
                  ((pair<slang::ConstantValue,_slang::SourceRange> *)&result,
                   (ConstantValue *)args_local,local_40);
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<slang::ConstantValue,slang::SourceRange>
                  ((pair<slang::ConstantValue,_slang::SourceRange> *)&result,
                   (pair<slang::ConstantValue,_slang::SourceRange> *)
                   ((long)&(key_local->value).
                           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   + 8));
        sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
        ::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>::
        templated_iterator(&local_a0,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = (ConstantValue *)
                        ((long)&key_local[1].value.
                                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        + 0x18);
            bVar1 = sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>::
                    is_empty((sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>
                              *)key_local);
            if (bVar1) {
              sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>::
              emplace<std::pair<slang::ConstantValue,slang::SourceRange>>
                        ((sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>> *)
                         key_local,(int8_t)current_entry_local._7_1_,
                         (pair<slang::ConstantValue,_slang::SourceRange> *)&result);
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              local_ad[0] = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>::templated_iterator<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_bool>
                          *)&this_local,&local_a0,local_ad);
              goto LAB_00661eb6;
            }
            if ((char)current_entry_local._7_1_ <=
                *(char *)&(key_local->value).
                          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               ) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::ConstantValue,slang::SourceRange>
                      ((pair<slang::ConstantValue,_slang::SourceRange> *)&result,
                       (pair<slang::ConstantValue,_slang::SourceRange> *)
                       ((long)&(key_local->value).
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       + 8));
            current_entry_local._7_1_ =
                 (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<std::pair<slang::ConstantValue,slang::SourceRange>,slang::ConstantValue,std::hash<slang::ConstantValue>,ska::detailv3::KeyOrValueHasher<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::hash<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::KeyOrValueEquality<slang::ConstantValue,std::pair<slang::ConstantValue,slang::SourceRange>,std::equal_to<slang::ConstantValue>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,slang::SourceRange>>,8ul>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x19]);
        std::swap<slang::ConstantValue,slang::SourceRange>
                  ((pair<slang::ConstantValue,_slang::SourceRange> *)&result,
                   &((local_a0.current)->field_1).value);
        sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
        ::grow((sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
                *)this);
        pVar6 = emplace<std::pair<slang::ConstantValue,slang::SourceRange>>
                          (this,(pair<slang::ConstantValue,_slang::SourceRange> *)&result);
        this_local = (sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
                      *)pVar6.first.current;
        local_10 = pVar6.second;
LAB_00661eb6:
        std::pair<slang::ConstantValue,_slang::SourceRange>::~pair
                  ((pair<slang::ConstantValue,_slang::SourceRange> *)&result);
        pVar6._8_8_ = extraout_RDX_00;
        pVar6.first.current = (EntryPointer)this_local;
      }
      goto LAB_00661ec2;
    }
  }
  sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
          *)this);
  pVar6 = emplace<slang::ConstantValue&,slang::SourceRange_const&>
                    (this,(ConstantValue *)args_local,local_40);
  local_10 = pVar6.second;
LAB_00661ec2:
  this_local = (sherwood_v3_table<std::pair<slang::ConstantValue,_slang::SourceRange>,_slang::ConstantValue,_std::hash<slang::ConstantValue>,_ska::detailv3::KeyOrValueHasher<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::hash<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::KeyOrValueEquality<slang::ConstantValue,_std::pair<slang::ConstantValue,_slang::SourceRange>,_std::equal_to<slang::ConstantValue>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ConstantValue,_slang::SourceRange>_>,_8UL>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }